

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::ModeState<duckdb::hugeint_t,duckdb::ModeStandard<duckdb::hugeint_t>>,duckdb::hugeint_t,duckdb::ModeFunction<duckdb::ModeStandard<duckdb::hugeint_t>>>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  long lVar1;
  ulong uVar2;
  FunctionData *pFVar3;
  ulong uVar4;
  ulong uVar5;
  idx_t iVar6;
  ulong uVar7;
  hugeint_t *phVar8;
  ulong uVar9;
  idx_t iVar10;
  ulong uVar11;
  AggregateUnaryInput input_data;
  AggregateUnaryInput local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  if (*input == (Vector)0x0) {
    lVar1 = *(long *)(input + 0x20);
    FlatVector::VerifyFlatVector(input);
    if (0x3f < count + 0x3f) {
      uVar7 = 0;
      uVar9 = 0;
      do {
        if (*(long *)(input + 0x28) == 0) {
          uVar4 = uVar9 + 0x40;
          if (count <= uVar9 + 0x40) {
            uVar4 = count;
          }
LAB_0055fa8d:
          uVar5 = uVar9;
          if (uVar9 < uVar4) {
            phVar8 = (hugeint_t *)(uVar9 * 0x10 + lVar1);
            do {
              BaseModeFunction<duckdb::ModeStandard<duckdb::hugeint_t>>::
              Execute<duckdb::hugeint_t,duckdb::ModeState<duckdb::hugeint_t,duckdb::ModeStandard<duckdb::hugeint_t>>,duckdb::ModeFunction<duckdb::ModeStandard<duckdb::hugeint_t>>>
                        ((ModeState<duckdb::hugeint_t,_duckdb::ModeStandard<duckdb::hugeint_t>_> *)
                         state,phVar8,aggr_input_data);
              uVar9 = uVar9 + 1;
              phVar8 = phVar8 + 1;
              uVar5 = uVar4;
            } while (uVar4 != uVar9);
          }
        }
        else {
          uVar2 = *(ulong *)(*(long *)(input + 0x28) + uVar7 * 8);
          uVar4 = uVar9 + 0x40;
          if (count <= uVar9 + 0x40) {
            uVar4 = count;
          }
          if (uVar2 == 0xffffffffffffffff) goto LAB_0055fa8d;
          uVar5 = uVar4;
          if ((uVar2 != 0) && (uVar5 = uVar9, uVar9 < uVar4)) {
            phVar8 = (hugeint_t *)(uVar9 * 0x10 + lVar1);
            uVar11 = 0;
            do {
              if ((uVar2 >> (uVar11 & 0x3f) & 1) != 0) {
                BaseModeFunction<duckdb::ModeStandard<duckdb::hugeint_t>>::
                Execute<duckdb::hugeint_t,duckdb::ModeState<duckdb::hugeint_t,duckdb::ModeStandard<duckdb::hugeint_t>>,duckdb::ModeFunction<duckdb::ModeStandard<duckdb::hugeint_t>>>
                          ((ModeState<duckdb::hugeint_t,_duckdb::ModeStandard<duckdb::hugeint_t>_> *
                           )state,phVar8,aggr_input_data);
              }
              uVar11 = uVar11 + 1;
              phVar8 = phVar8 + 1;
              uVar5 = uVar4;
            } while (uVar4 - uVar9 != uVar11);
          }
        }
        uVar7 = uVar7 + 1;
        uVar9 = uVar5;
      } while (uVar7 != count + 0x3f >> 6);
    }
  }
  else if (*input == (Vector)0x2) {
    if ((*(byte **)(input + 0x28) == (byte *)0x0) || ((**(byte **)(input + 0x28) & 1) != 0)) {
      local_78.input_mask = (ValidityMask *)(input + 0x28);
      local_78.input_idx = 0;
      local_78.input = aggr_input_data;
      TypedModeFunction<duckdb::ModeStandard<duckdb::hugeint_t>>::
      ConstantOperation<duckdb::hugeint_t,duckdb::ModeState<duckdb::hugeint_t,duckdb::ModeStandard<duckdb::hugeint_t>>,duckdb::ModeFunction<duckdb::ModeStandard<duckdb::hugeint_t>>>
                ((ModeState<duckdb::hugeint_t,_duckdb::ModeStandard<duckdb::hugeint_t>_> *)state,
                 *(hugeint_t **)(input + 0x20),&local_78,count);
    }
  }
  else {
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
    duckdb::Vector::ToUnifiedFormat((ulong)input,(UnifiedVectorFormat *)count);
    if (local_78.input_idx == 0) {
      if (count != 0) {
        pFVar3 = ((local_78.input)->bind_data).ptr;
        iVar10 = 0;
        do {
          iVar6 = iVar10;
          if (pFVar3 != (FunctionData *)0x0) {
            iVar6 = (idx_t)*(uint *)(pFVar3 + iVar10 * 4);
          }
          BaseModeFunction<duckdb::ModeStandard<duckdb::hugeint_t>>::
          Execute<duckdb::hugeint_t,duckdb::ModeState<duckdb::hugeint_t,duckdb::ModeStandard<duckdb::hugeint_t>>,duckdb::ModeFunction<duckdb::ModeStandard<duckdb::hugeint_t>>>
                    ((ModeState<duckdb::hugeint_t,_duckdb::ModeStandard<duckdb::hugeint_t>_> *)state
                     ,(hugeint_t *)
                      (&((local_78.input_mask)->super_TemplatedValidityMask<unsigned_long>).
                        validity_mask + iVar6 * 2),aggr_input_data);
          iVar10 = iVar10 + 1;
        } while (count != iVar10);
      }
    }
    else if (count != 0) {
      pFVar3 = ((local_78.input)->bind_data).ptr;
      iVar10 = 0;
      do {
        iVar6 = iVar10;
        if (pFVar3 != (FunctionData *)0x0) {
          iVar6 = (idx_t)*(uint *)(pFVar3 + iVar10 * 4);
        }
        if ((local_78.input_idx == 0) ||
           ((*(ulong *)(local_78.input_idx + (iVar6 >> 6) * 8) >> (iVar6 & 0x3f) & 1) != 0)) {
          BaseModeFunction<duckdb::ModeStandard<duckdb::hugeint_t>>::
          Execute<duckdb::hugeint_t,duckdb::ModeState<duckdb::hugeint_t,duckdb::ModeStandard<duckdb::hugeint_t>>,duckdb::ModeFunction<duckdb::ModeStandard<duckdb::hugeint_t>>>
                    ((ModeState<duckdb::hugeint_t,_duckdb::ModeStandard<duckdb::hugeint_t>_> *)state
                     ,(hugeint_t *)
                      (&((local_78.input_mask)->super_TemplatedValidityMask<unsigned_long>).
                        validity_mask + iVar6 * 2),aggr_input_data);
        }
        iVar10 = iVar10 + 1;
      } while (count != iVar10);
    }
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}